

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

bool __thiscall IntBounds::RequiresIntBoundedValueInfo(IntBounds *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool bVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  local_1a[0] = valueType.field_0;
  bVar2 = ValueType::IsLikelyInt((ValueType *)&local_1a[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x39,"(valueType.IsLikelyInt())","valueType.IsLikelyInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsInt((ValueType *)&local_1a[0].field_0);
  bVar4 = true;
  if (((bVar2) && (this->wasConstantUpperBoundEstablishedExplicitly == false)) &&
     ((this->relativeLowerBounds).
      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      .count == (this->relativeLowerBounds).
                super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                .freeCount)) {
    bVar4 = (this->relativeUpperBounds).
            super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            .count != (this->relativeUpperBounds).
                      super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      .freeCount;
  }
  return bVar4;
}

Assistant:

bool IntBounds::RequiresIntBoundedValueInfo(const ValueType valueType) const
{
    Assert(valueType.IsLikelyInt());
    return !valueType.IsInt() || RequiresIntBoundedValueInfo();
}